

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O0

Element_p __thiscall indigox::PeriodicTable::GetElement(PeriodicTable *this,string *name)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  key_type *in_RSI;
  element_type *in_RDI;
  Element_p EVar2;
  string u;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
  *in_stack_ffffffffffffff68;
  element_type *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
  *this_01;
  _Self local_58 [3];
  _Self local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
  local_38;
  
  this_01 = &local_38;
  this_00 = in_RDI;
  utils::toUpperFirst(&in_RDI->name_);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x124938);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::operator!=(&local_40,local_58);
  if (bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
    ::at(this_01,in_RSI);
    std::weak_ptr<indigox::Element>::lock((weak_ptr<indigox::Element> *)this_00);
  }
  else {
    std::shared_ptr<indigox::Element>::shared_ptr((shared_ptr<indigox::Element> *)0x1249c6);
  }
  std::__cxx11::string::~string((string *)&local_38);
  EVar2.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Element_p)EVar2.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element_p PeriodicTable::GetElement(std::string name) const {
    std::string u = utils::toUpperFirst(&name);
    if (name_to_.find(u) != name_to_.end()) {
      return name_to_.at(name).lock();
    }
    return Element_p();
  }